

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          *drawTypes)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  char *pcVar4;
  size_t ndx;
  ulong uVar5;
  ostringstream stream;
  undefined1 auStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  lVar3 = *(long *)this;
  if (*(long *)(this + 8) == lVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"_none","");
  }
  else {
    uVar5 = 0;
    do {
      iVar1 = *(int *)(lVar3 + uVar5 * 4);
      if (iVar1 == 0) {
        lVar3 = 6;
        pcVar4 = "_clear";
LAB_00e51104:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar4,lVar3);
      }
      else if (iVar1 == 1) {
        lVar3 = 7;
        pcVar4 = "_render";
        goto LAB_00e51104;
      }
      uVar5 = uVar5 + 1;
      lVar3 = *(long *)this;
    } while (uVar5 < (ulong)(*(long *)(this + 8) - lVar3 >> 2));
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return psVar2;
}

Assistant:

string generateDrawTypeName (const vector<BufferAgeTest::DrawType>& drawTypes)
{
	std::ostringstream stream;
	if (drawTypes.size() == 0)
		return string("_none");

	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_RENDER)
			stream << "_render";
		else if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_CLEAR)
			stream << "_clear";
		else
			DE_ASSERT(false);
	}
	return stream.str();
}